

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O1

MessageLite *
google::protobuf::internal::MergePartialFromCodedStreamHelper::Add
          (RepeatedPtrFieldBase *field,MessageLite *prototype)

{
  int iVar1;
  Rep *pRVar2;
  int iVar3;
  undefined4 extraout_var;
  
  pRVar2 = field->rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = field->current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      field->current_size_ = iVar1 + 1;
      return (MessageLite *)pRVar2->elements[iVar1];
    }
    if (pRVar2->allocated_size != field->total_size_) goto LAB_0015f687;
  }
  RepeatedPtrFieldBase::Reserve(field,field->total_size_ + 1);
LAB_0015f687:
  field->rep_->allocated_size = field->rep_->allocated_size + 1;
  iVar3 = (*prototype->_vptr_MessageLite[4])(prototype,field->arena_);
  iVar1 = field->current_size_;
  field->current_size_ = iVar1 + 1;
  field->rep_->elements[iVar1] = (MessageLite *)CONCAT44(extraout_var,iVar3);
  return (MessageLite *)CONCAT44(extraout_var,iVar3);
}

Assistant:

static MessageLite* Add(RepeatedPtrFieldBase* field,
                          const MessageLite* prototype) {
    return field->Add<RepeatedMessageTypeHandler>(
        const_cast<MessageLite*>(prototype));
  }